

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  ulong uVar1;
  uint32_t *puVar2;
  HasherCommon *pHVar3;
  int iVar4;
  ulong max_backward_limit;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint8_t *puVar13;
  ulong uVar14;
  BackwardMatch *pBVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t num_matches;
  int *data;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  ZopfliNode *nodes_00;
  ulong local_19c8;
  uint local_19c0;
  uint local_19b0;
  ulong local_19a0;
  uint local_1998;
  ulong local_1990;
  size_t local_1988;
  long local_1970;
  long local_1958;
  uint32_t local_18f8 [38];
  StartPosQueue queue;
  BackwardMatch matches [384];
  ZopfliCostModel model;
  
  sVar8 = params->stream_offset;
  max_backward_limit = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar9 = 0x145;
  if (params->quality < 0xb) {
    uVar9 = 0x96;
  }
  lVar11 = num_bytes - 0x7f;
  if (num_bytes < 0x7f) {
    lVar11 = 0;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  local_1988 = 0;
  do {
    if (num_bytes <= local_1988 + 3) {
      CleanupZopfliCostModel(m,&model);
      sVar8 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar8;
    }
    uVar1 = local_1988 + position;
    uVar27 = max_backward_limit;
    if (uVar1 < max_backward_limit) {
      uVar27 = uVar1;
    }
    uVar5 = sVar8 + uVar1;
    if (max_backward_limit <= uVar5) {
      uVar5 = max_backward_limit;
    }
    uVar16 = num_bytes - local_1988;
    uVar22 = 0x10;
    if (params->quality == 0xb) {
      uVar22 = 0x40;
    }
    uVar12 = 0;
    if (uVar22 <= uVar1) {
      uVar12 = uVar1 - uVar22;
    }
    data = (int *)(ringbuffer + (uVar1 & ringbuffer_mask));
    pBVar15 = matches;
    uVar22 = uVar1;
    uVar7 = 1;
    while (((uVar22 = uVar22 - 1, uVar12 < uVar22 && (uVar7 < 3)) && (uVar1 - uVar22 <= uVar27))) {
      uVar24 = uVar22 & ringbuffer_mask;
      if (((uint8_t)*data == ringbuffer[uVar24]) &&
         (*(uint8_t *)((long)data + 1) == ringbuffer[uVar24 + 1])) {
        uVar17 = 0;
        lVar28 = 0;
LAB_00111014:
        uVar21 = uVar16 & 0xfffffffffffffff8;
        uVar14 = (ulong)((uint)uVar16 & 7);
        if (uVar16 >> 3 == uVar17) {
          for (; (uVar17 = uVar16, uVar14 != 0 &&
                 (uVar17 = uVar21, ringbuffer[uVar21 + uVar24] == *(uint8_t *)((long)data + uVar21))
                 ); uVar21 = uVar21 + 1) {
            uVar14 = uVar14 - 1;
          }
        }
        else {
          if (*(ulong *)(data + uVar17 * 2) == *(ulong *)(ringbuffer + uVar17 * 8 + uVar24))
          goto code_r0x00111026;
          uVar17 = *(ulong *)(ringbuffer + uVar17 * 8 + uVar24) ^ *(ulong *)(data + uVar17 * 2);
          uVar24 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar17 = (uVar24 >> 3 & 0x1fffffff) - lVar28;
        }
        if (uVar7 < uVar17) {
          pBVar15->distance = (uint32_t)(uVar1 - uVar22);
          pBVar15->length_and_code = (int)uVar17 << 5;
          pBVar15 = pBVar15 + 1;
          uVar7 = uVar17;
        }
      }
    }
    local_1998 = (uint)ringbuffer_mask;
    if (uVar7 < uVar16) {
      uVar19 = (uint)(*data * 0x1e35a7bd) >> 0xf;
      uVar22 = (hasher->privat)._H5.bucket_size_;
      puVar2 = (hasher->privat)._H2.buckets_;
      pHVar3 = (hasher->privat)._H40.common;
      uVar10 = puVar2[uVar19];
      uVar12 = uVar16;
      if (0x7f < uVar16) {
        puVar2[uVar19] = (uint32_t)uVar1;
        uVar12 = 0x80;
      }
      uVar24 = uVar22 & uVar1;
      local_1958 = uVar24 * 2 + 1;
      local_1970 = uVar24 * 2;
      uVar24 = 0;
      local_19c8 = 0;
      lVar28 = 0x40;
      while (uVar17 = uVar1 - uVar10, uVar17 != 0) {
        bVar29 = lVar28 == 0;
        lVar28 = lVar28 + -1;
        if ((uVar27 < uVar17) || (bVar29)) break;
        uVar21 = local_19c8;
        if (uVar24 < local_19c8) {
          uVar21 = uVar24;
        }
        lVar23 = uVar21 + (uVar10 & local_1998);
        uVar18 = uVar16 - uVar21;
        uVar25 = uVar18 & 0xfffffffffffffff8;
        uVar14 = 0;
        lVar20 = 0;
LAB_00111183:
        if (uVar18 >> 3 == uVar14) {
          uVar26 = (ulong)((uint)uVar18 & 7);
          puVar13 = ringbuffer + (lVar23 - lVar20);
          for (; (bVar29 = uVar26 != 0, uVar26 = uVar26 - 1, uVar14 = uVar18, bVar29 &&
                 (uVar14 = uVar25, *(uint8_t *)((long)data + uVar25 + uVar21) == *puVar13));
              uVar25 = uVar25 + 1) {
            puVar13 = puVar13 + 1;
          }
        }
        else {
          uVar26 = *(ulong *)((long)data + uVar14 * 8 + uVar21);
          if (*(ulong *)(ringbuffer + uVar14 * 8 + lVar23) == uVar26) goto code_r0x0011119f;
          uVar26 = uVar26 ^ *(ulong *)(ringbuffer + uVar14 * 8 + lVar23);
          uVar14 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          uVar14 = (uVar14 >> 3 & 0x1fffffff) - lVar20;
        }
        uVar14 = uVar14 + uVar21;
        if (pBVar15 == (BackwardMatch *)0x0) {
          pBVar15 = (BackwardMatch *)0x0;
        }
        else if (uVar7 < uVar14) {
          pBVar15->distance = (uint32_t)uVar17;
          pBVar15->length_and_code = (int)uVar14 << 5;
          pBVar15 = pBVar15 + 1;
          uVar7 = uVar14;
        }
        local_19c0 = (uint)uVar22;
        if (uVar12 <= uVar14) {
          if (uVar16 < 0x80) goto LAB_0011131b;
          *(undefined4 *)((long)&pHVar3->extra + local_1970 * 4) =
               *(undefined4 *)(&pHVar3->extra + (local_19c0 & uVar10));
          iVar4 = *(int *)((long)&pHVar3->extra + (ulong)(local_19c0 & uVar10) * 8 + 4);
          goto LAB_00111301;
        }
        if (ringbuffer[uVar14 + (uVar10 & local_1998)] < *(byte *)((long)data + uVar14)) {
          if (0x7f < uVar16) {
            *(uint *)((long)&pHVar3->extra + local_1970 * 4) = uVar10;
          }
          lVar23 = (ulong)(uVar10 & local_19c0) * 2 + 1;
          uVar24 = uVar14;
          local_1970 = lVar23;
        }
        else {
          if (0x7f < uVar16) {
            *(uint *)((long)&pHVar3->extra + local_1958 * 4) = uVar10;
          }
          lVar23 = (ulong)(uVar10 & local_19c0) * 2;
          local_19c8 = uVar14;
          local_1958 = lVar23;
        }
        uVar10 = *(uint *)((long)&pHVar3->extra + lVar23 * 4);
      }
      if (0x7f < uVar16) {
        iVar4 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)&pHVar3->extra + local_1970 * 4) = iVar4;
LAB_00111301:
        *(int *)((long)&pHVar3->extra + local_1958 * 4) = iVar4;
      }
    }
LAB_0011131b:
    for (lVar28 = 0; lVar28 != 0x26; lVar28 = lVar28 + 1) {
      local_18f8[lVar28] = 0xfffffff;
    }
    uVar27 = uVar7 + 1;
    if (uVar7 + 1 < 5) {
      uVar27 = 4;
    }
    nodes_00 = (ZopfliNode *)0x111362;
    iVar4 = BrotliFindAllStaticDictionaryMatches
                      (&params->dictionary,(uint8_t *)data,uVar27,uVar16,local_18f8);
    if (iVar4 != 0) {
      nodes_00 = (ZopfliNode *)0x25;
      if (0x24 < uVar16) {
        uVar16 = 0x25;
      }
      iVar4 = (int)uVar27 << 5;
      for (; uVar27 <= uVar16; uVar27 = uVar27 + 1) {
        uVar10 = local_18f8[uVar27];
        if ((uVar10 < 0xfffffff) &&
           (uVar22 = (ulong)(uVar10 >> 5) + uVar5 + 1, uVar22 <= (params->dist).max_distance)) {
          uVar10 = uVar10 & 0x1f;
          pBVar15->distance = (uint32_t)uVar22;
          if (uVar27 == uVar10) {
            uVar10 = 0;
          }
          pBVar15->length_and_code = uVar10 + iVar4;
          pBVar15 = pBVar15 + 1;
        }
        iVar4 = iVar4 + 0x20;
      }
    }
    if ((long)pBVar15 - (long)matches == 0) {
      num_matches = 0;
    }
    else {
      num_matches = (long)pBVar15 - (long)matches >> 3;
      if (uVar9 < pBVar15[-1].length_and_code >> 5) {
        matches[0] = matches[num_matches - 1];
        nodes_00 = (ZopfliNode *)0x1;
        num_matches = 1;
      }
    }
    sVar6 = UpdateNodes(num_bytes,position,local_1988,ringbuffer,ringbuffer_mask,params,
                        max_backward_limit,dist_cache,num_matches,matches,&model,&queue,nodes);
    uVar27 = 0;
    if (0x3fff < sVar6) {
      uVar27 = sVar6;
    }
    if (num_matches == 1) {
      uVar10 = matches[0].length_and_code >> 5;
      if ((uVar9 < uVar10) && (uVar27 < uVar10)) {
        uVar27 = (ulong)uVar10;
      }
    }
    if (1 < uVar27) {
      uVar5 = uVar1 + 1;
      uVar22 = uVar27 + uVar1;
      if (lVar11 + position <= uVar27 + uVar1) {
        uVar22 = lVar11 + position;
      }
      uVar16 = uVar22 - 0x3f;
      if (uVar22 < uVar1 + 0x40) {
        uVar16 = uVar5;
      }
      if (uVar1 + 0x201 <= uVar16) {
        for (; uVar5 < uVar16; uVar5 = uVar5 + 8) {
          uVar1 = (hasher->privat)._H5.bucket_size_;
          puVar2 = (hasher->privat)._H2.buckets_;
          uVar24 = uVar5 & ringbuffer_mask;
          pHVar3 = (hasher->privat)._H40.common;
          uVar19 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0xf;
          uVar10 = puVar2[uVar19];
          local_19c8 = (uVar1 & uVar5) * 2 + 1;
          local_19a0 = (uVar1 & uVar5) * 2;
          puVar2[uVar19] = (uint32_t)uVar5;
          uVar7 = 0;
          uVar12 = 0;
          nodes_00 = (ZopfliNode *)0x40;
          lVar28 = 0x40;
          while (uVar5 != uVar10) {
            bVar29 = lVar28 == 0;
            lVar28 = lVar28 + -1;
            if ((uVar1 - 0xf < uVar5 - uVar10) || (bVar29)) break;
            uVar17 = uVar12;
            if (uVar7 < uVar12) {
              uVar17 = uVar7;
            }
            lVar23 = uVar17 + (uVar10 & local_1998);
            uVar18 = 0x80 - uVar17;
            uVar21 = uVar18 & 0xfffffffffffffff8;
            uVar14 = 0;
            lVar20 = 0;
LAB_001115e7:
            if (uVar18 >> 3 == uVar14) {
              uVar25 = (ulong)((uint)uVar18 & 7);
              puVar13 = ringbuffer + (lVar23 - lVar20);
              for (; (bVar29 = uVar25 != 0, uVar25 = uVar25 - 1, uVar14 = uVar18, bVar29 &&
                     (uVar14 = uVar21, ringbuffer[uVar21 + uVar17 + uVar24] == *puVar13));
                  uVar21 = uVar21 + 1) {
                puVar13 = puVar13 + 1;
              }
            }
            else {
              if (*(ulong *)(ringbuffer + uVar14 * 8 + lVar23) ==
                  *(ulong *)(ringbuffer + uVar14 * 8 + uVar17 + uVar24)) goto code_r0x00111603;
              uVar14 = *(ulong *)(ringbuffer + uVar14 * 8 + uVar17 + uVar24) ^
                       *(ulong *)(ringbuffer + uVar14 * 8 + lVar23);
              uVar21 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar14 = (uVar21 >> 3 & 0x1fffffff) - lVar20;
            }
            uVar14 = uVar14 + uVar17;
            local_19c0 = (uint)uVar1;
            if (0x7f < uVar14) {
              *(undefined4 *)((long)&pHVar3->extra + local_19a0 * 4) =
                   *(undefined4 *)(&pHVar3->extra + (local_19c0 & uVar10));
              iVar4 = *(int *)((long)&pHVar3->extra + (ulong)(local_19c0 & uVar10) * 8 + 4);
              goto LAB_001116dc;
            }
            uVar17 = (ulong)(uVar10 & local_19c0) * 2;
            if (ringbuffer[uVar14 + (uVar10 & local_1998)] < ringbuffer[uVar14 + uVar24]) {
              *(uint *)((long)&pHVar3->extra + local_19a0 * 4) = uVar10;
              uVar17 = uVar17 | 1;
              uVar7 = uVar14;
              local_19a0 = uVar17;
            }
            else {
              *(uint *)((long)&pHVar3->extra + local_19c8 * 4) = uVar10;
              uVar12 = uVar14;
              local_19c8 = uVar17;
            }
            uVar10 = *(uint *)((long)&pHVar3->extra + uVar17 * 4);
          }
          iVar4 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)&pHVar3->extra + local_19a0 * 4) = iVar4;
LAB_001116dc:
          *(int *)((long)&pHVar3->extra + local_19c8 * 4) = iVar4;
        }
      }
      for (; uVar16 < uVar22; uVar16 = uVar16 + 1) {
        uVar1 = (hasher->privat)._H5.bucket_size_;
        puVar2 = (hasher->privat)._H2.buckets_;
        uVar7 = uVar16 & ringbuffer_mask;
        pHVar3 = (hasher->privat)._H40.common;
        uVar19 = (uint)(*(int *)(ringbuffer + uVar7) * 0x1e35a7bd) >> 0xf;
        uVar10 = puVar2[uVar19];
        local_1990 = (uVar1 & uVar16) * 2 + 1;
        local_19c8 = (uVar1 & uVar16) * 2;
        puVar2[uVar19] = (uint32_t)uVar16;
        uVar12 = 0;
        uVar5 = 0;
        nodes_00 = (ZopfliNode *)0x40;
        lVar28 = 0x40;
        while (uVar16 != uVar10) {
          bVar29 = lVar28 == 0;
          lVar28 = lVar28 + -1;
          if ((uVar1 - 0xf < uVar16 - uVar10) || (bVar29)) break;
          uVar24 = uVar5;
          if (uVar12 < uVar5) {
            uVar24 = uVar12;
          }
          lVar23 = uVar24 + (uVar10 & local_1998);
          uVar14 = 0x80 - uVar24;
          uVar17 = uVar14 & 0xfffffffffffffff8;
          uVar21 = 0;
          lVar20 = 0;
LAB_001117c7:
          if (uVar14 >> 3 == uVar21) {
            uVar18 = (ulong)((uint)uVar14 & 7);
            puVar13 = ringbuffer + (lVar23 - lVar20);
            for (; (bVar29 = uVar18 != 0, uVar18 = uVar18 - 1, uVar21 = uVar14, bVar29 &&
                   (uVar21 = uVar17, ringbuffer[uVar17 + uVar24 + uVar7] == *puVar13));
                uVar17 = uVar17 + 1) {
              puVar13 = puVar13 + 1;
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar21 * 8 + lVar23) ==
                *(ulong *)(ringbuffer + uVar21 * 8 + uVar24 + uVar7)) goto code_r0x001117e3;
            uVar21 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar24 + uVar7) ^
                     *(ulong *)(ringbuffer + uVar21 * 8 + lVar23);
            uVar17 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar21 = (uVar17 >> 3 & 0x1fffffff) - lVar20;
          }
          uVar21 = uVar21 + uVar24;
          local_19b0 = (uint)uVar1;
          if (0x7f < uVar21) {
            *(undefined4 *)((long)&pHVar3->extra + local_19c8 * 4) =
                 *(undefined4 *)(&pHVar3->extra + (local_19b0 & uVar10));
            iVar4 = *(int *)((long)&pHVar3->extra + (ulong)(local_19b0 & uVar10) * 8 + 4);
            goto LAB_001118c3;
          }
          uVar24 = (ulong)(uVar10 & local_19b0) * 2;
          if (ringbuffer[uVar21 + (uVar10 & local_1998)] < ringbuffer[uVar21 + uVar7]) {
            *(uint *)((long)&pHVar3->extra + local_19c8 * 4) = uVar10;
            uVar24 = uVar24 | 1;
            uVar12 = uVar21;
            local_19c8 = uVar24;
          }
          else {
            *(uint *)((long)&pHVar3->extra + local_1990 * 4) = uVar10;
            uVar5 = uVar21;
            local_1990 = uVar24;
          }
          uVar10 = *(uint *)((long)&pHVar3->extra + uVar24 * 4);
        }
        iVar4 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)&pHVar3->extra + local_19c8 * 4) = iVar4;
LAB_001118c3:
        *(int *)((long)&pHVar3->extra + local_1990 * 4) = iVar4;
      }
      while (uVar27 = uVar27 - 1, uVar27 != 0) {
        if (num_bytes <= local_1988 + 4) {
          local_1988 = local_1988 + 1;
          break;
        }
        local_1988 = local_1988 + 1;
        EvaluateNode(position + sVar8,local_1988,max_backward_limit,(size_t)dist_cache,(int *)&model
                     ,(ZopfliCostModel *)&queue,(StartPosQueue *)nodes,nodes_00);
      }
    }
    local_1988 = local_1988 + 1;
  } while( true );
code_r0x00111026:
  lVar28 = lVar28 + -8;
  uVar17 = uVar17 + 1;
  goto LAB_00111014;
code_r0x0011119f:
  lVar20 = lVar20 + -8;
  uVar14 = uVar14 + 1;
  goto LAB_00111183;
code_r0x00111603:
  lVar20 = lVar20 + -8;
  uVar14 = uVar14 + 1;
  goto LAB_001115e7;
code_r0x001117e3:
  lVar20 = lVar20 + -8;
  uVar21 = uVar21 + 1;
  goto LAB_001117c7;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  BROTLI_UNUSED(literal_context_lut);
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}